

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlGetDtdAttrDesc(void)

{
  int iVar1;
  int iVar2;
  xmlDtdPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlAttributePtr val_02;
  int local_44;
  int n_name;
  xmlChar *name;
  int n_elem;
  xmlChar *elem;
  int n_dtd;
  xmlDtdPtr dtd;
  xmlAttributePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (elem._4_4_ = 0; (int)elem._4_4_ < 3; elem._4_4_ = elem._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlDtdPtr(elem._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(name._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        val_02 = (xmlAttributePtr)xmlGetDtdAttrDesc(val,val_00,val_01);
        desret_xmlAttributePtr(val_02);
        call_tests = call_tests + 1;
        des_xmlDtdPtr(elem._4_4_,val,0);
        des_const_xmlChar_ptr(name._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetDtdAttrDesc",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)elem._4_4_);
          printf(" %d",(ulong)name._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlGetDtdAttrDesc(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttributePtr ret_val;
    xmlDtdPtr dtd; /* a pointer to the DtD to search */
    int n_dtd;
    xmlChar * elem; /* the element name */
    int n_elem;
    xmlChar * name; /* the attribute name */
    int n_name;

    for (n_dtd = 0;n_dtd < gen_nb_xmlDtdPtr;n_dtd++) {
    for (n_elem = 0;n_elem < gen_nb_const_xmlChar_ptr;n_elem++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        dtd = gen_xmlDtdPtr(n_dtd, 0);
        elem = gen_const_xmlChar_ptr(n_elem, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);

        ret_val = xmlGetDtdAttrDesc(dtd, (const xmlChar *)elem, (const xmlChar *)name);
        desret_xmlAttributePtr(ret_val);
        call_tests++;
        des_xmlDtdPtr(n_dtd, dtd, 0);
        des_const_xmlChar_ptr(n_elem, (const xmlChar *)elem, 1);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlGetDtdAttrDesc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_dtd);
            printf(" %d", n_elem);
            printf(" %d", n_name);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}